

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCullDistanceTests.cpp
# Opt level: O0

void glcts::CullDistance::Utilities::replaceAll(string *str,string *from,string *to)

{
  string *psVar1;
  undefined8 local_28;
  size_t start_pos;
  string *to_local;
  string *from_local;
  string *str_local;
  
  local_28 = std::__cxx11::string::find((string *)str,(ulong)from);
  while (local_28 != 0xffffffffffffffff) {
    psVar1 = (string *)std::__cxx11::string::length();
    std::__cxx11::string::replace((ulong)str,local_28,psVar1);
    std::__cxx11::string::length();
    local_28 = std::__cxx11::string::find((string *)str,(ulong)from);
  }
  return;
}

Assistant:

void CullDistance::Utilities::replaceAll(std::string& str, const std::string& from, const std::string& to)
{
	for (size_t start_pos = str.find(from, 0); start_pos != std::string::npos; start_pos = str.find(from, start_pos))
	{
		str.replace(start_pos, from.length(), to);

		start_pos += to.length();
	}

	return;
}